

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O1

void * ecs_table_column(ecs_iter_t *it,int32_t column_index)

{
  short sVar1;
  ecs_table_t *peVar2;
  int32_t iVar3;
  void *pvVar4;
  int16_t offset;
  long lVar5;
  
  _ecs_assert(it->table != (ecs_iter_table_t *)0x0,2,(char *)0x0,"it->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0xfa);
  if (it->table == (ecs_iter_table_t *)0x0) {
    __assert_fail("it->table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0xfa,"void *ecs_table_column(const ecs_iter_t *, int32_t)");
  }
  _ecs_assert(it->table->table != (ecs_table_t *)0x0,0xc,(char *)0x0,"it->table->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0xfb);
  peVar2 = it->table->table;
  if (peVar2 == (ecs_table_t *)0x0) {
    __assert_fail("it->table->table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0xfb,"void *ecs_table_column(const ecs_iter_t *, int32_t)");
  }
  iVar3 = ecs_vector_count(peVar2->type);
  _ecs_assert(column_index < iVar3,2,(char *)0x0,"column_index < ecs_vector_count(table->type)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0xff);
  iVar3 = ecs_vector_count(peVar2->type);
  if (iVar3 <= column_index) {
    __assert_fail("column_index < ecs_vector_count(table->type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0xff,"void *ecs_table_column(const ecs_iter_t *, int32_t)");
  }
  if (column_index < peVar2->column_count) {
    pvVar4 = it->table_columns;
    lVar5 = (long)column_index * 0x10;
    sVar1 = *(short *)((long)pvVar4 + lVar5 + 10);
    offset = 0x10;
    if (0x10 < sVar1) {
      offset = sVar1;
    }
    pvVar4 = _ecs_vector_first(*(ecs_vector_t **)((long)pvVar4 + lVar5),
                               (int)*(short *)((long)pvVar4 + lVar5 + 8),offset);
    return pvVar4;
  }
  return (void *)0x0;
}

Assistant:

void* ecs_table_column(
    const ecs_iter_t *it,
    int32_t column_index)
{
    /* See ecs_iter_type */ 
    ecs_assert(it->table != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(it->table->table != NULL, ECS_INTERNAL_ERROR, NULL);
    
    ecs_table_t *table = it->table->table;
    ecs_assert(column_index < ecs_vector_count(table->type), 
        ECS_INVALID_PARAMETER, NULL);
    
    if (table->column_count <= column_index) {
        return NULL;
    }

    ecs_column_t *columns = it->table_columns;
    ecs_column_t *column = &columns[column_index];
    return ecs_vector_first_t(column->data, column->size, column->alignment);
}